

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_iov.c
# Opt level: O1

mk_iov * mk_iov_realloc(mk_iov *mk_io,int new_size)

{
  int iVar1;
  iovec *piVar2;
  iovec *piVar3;
  mk_iov *pmVar4;
  long lVar5;
  
  pmVar4 = mk_iov_create(new_size,0);
  if (pmVar4 == (mk_iov *)0x0) {
    pmVar4 = (mk_iov *)0x0;
  }
  else {
    pmVar4->iov_idx = mk_io->iov_idx;
    pmVar4->buf_idx = mk_io->buf_idx;
    pmVar4->size = new_size;
    pmVar4->total_len = mk_io->total_len;
    iVar1 = mk_io->iov_idx;
    if (0 < (long)iVar1) {
      piVar2 = mk_io->io;
      piVar3 = pmVar4->io;
      lVar5 = 0;
      do {
        *(undefined8 *)((long)&piVar3->iov_base + lVar5) =
             *(undefined8 *)((long)&piVar2->iov_base + lVar5);
        *(undefined8 *)((long)&piVar3->iov_len + lVar5) =
             *(undefined8 *)((long)&piVar2->iov_len + lVar5);
        lVar5 = lVar5 + 0x10;
      } while ((long)iVar1 * 0x10 != lVar5);
    }
    iVar1 = mk_io->buf_idx;
    if (0 < (long)iVar1) {
      lVar5 = 0;
      do {
        pmVar4->buf_to_free[lVar5] = mk_io->buf_to_free[lVar5];
        lVar5 = lVar5 + 1;
      } while (iVar1 != lVar5);
    }
  }
  return pmVar4;
}

Assistant:

struct mk_iov *mk_iov_realloc(struct mk_iov *mk_io, int new_size)
{
    int i;
    struct mk_iov *iov;

    /*
     * We do not perform a memory realloc because our struct iov have
     * self references on it 'io' and 'buf_to_free' pointers. So we create a
     * new mk_iov and perform a data migration.
     */
    iov = mk_iov_create(new_size, 0);
    if (!iov) {
        return NULL;
    }

    /* Migrate data */
    iov->iov_idx   = mk_io->iov_idx;
    iov->buf_idx   = mk_io->buf_idx;
    iov->size      = new_size;
    iov->total_len = mk_io->total_len;

    for (i = 0; i < mk_io->iov_idx; i++) {
        iov->io[i].iov_base = mk_io->io[i].iov_base;
        iov->io[i].iov_len  = mk_io->io[i].iov_len;
    }

    for (i = 0; i < mk_io->buf_idx; i++) {
        iov->buf_to_free[i] = mk_io->buf_to_free[i];
    }

    return iov;
}